

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsMakeUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)22>_> *
vkt::FragmentOperations::makeDescriptorSet
          (Move<vk::Handle<(vk::HandleType)22>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkDescriptorPool descriptorPool,VkDescriptorSetLayout setLayout)

{
  undefined1 local_58 [8];
  VkDescriptorSetAllocateInfo info;
  VkDevice device_local;
  DeviceInterface *vk_local;
  VkDescriptorSetLayout setLayout_local;
  VkDescriptorPool descriptorPool_local;
  
  local_58._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  info._4_4_ = 0;
  info.descriptorPool.m_internal._0_4_ = 1;
  info._24_8_ = &vk_local;
  info.pNext = (void *)descriptorPool.m_internal;
  info.pSetLayouts = (VkDescriptorSetLayout *)device;
  vk_local = (DeviceInterface *)setLayout.m_internal;
  setLayout_local.m_internal = descriptorPool.m_internal;
  ::vk::allocateDescriptorSet
            (__return_storage_ptr__,vk,device,(VkDescriptorSetAllocateInfo *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Move<VkDescriptorSet> makeDescriptorSet (const DeviceInterface&			vk,
										 const VkDevice					device,
										 const VkDescriptorPool			descriptorPool,
										 const VkDescriptorSetLayout	setLayout)
{
	const VkDescriptorSetAllocateInfo info =
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,		// VkStructureType				sType;
		DE_NULL,											// const void*					pNext;
		descriptorPool,										// VkDescriptorPool				descriptorPool;
		1u,													// deUint32						descriptorSetCount;
		&setLayout,											// const VkDescriptorSetLayout*	pSetLayouts;
	};
	return allocateDescriptorSet(vk, device, &info);
}